

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix4d * tinyusdz::to_matrix(matrix4d *__return_storage_ptr__,quatd *q)

{
  double3x3 m33;
  vec<double,_4> local_78;
  mat<double,_3,_3> local_58;
  
  local_78.x = (q->imag)._M_elems[0];
  local_78.y = (q->imag)._M_elems[1];
  local_78.z = (q->imag)._M_elems[2];
  local_78.w = q->real;
  linalg::qmat<double>(&local_58,&local_78);
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  Identity(__return_storage_ptr__);
  __return_storage_ptr__->m[0][0] = local_58.x.x;
  __return_storage_ptr__->m[0][1] = local_58.x.y;
  __return_storage_ptr__->m[0][2] = local_58.x.z;
  __return_storage_ptr__->m[1][0] = local_58.y.x;
  __return_storage_ptr__->m[1][1] = local_58.y.y;
  __return_storage_ptr__->m[1][2] = local_58.y.z;
  __return_storage_ptr__->m[2][0] = local_58.z.x;
  __return_storage_ptr__->m[2][1] = local_58.z.y;
  __return_storage_ptr__->m[2][2] = local_58.z.z;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d to_matrix(const value::quatd &q) {
  double3x3 m33 =
      linalg::qmat<double>({q.imag[0], q.imag[1], q.imag[2], q.real});

  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33[0][0];
  m.m[0][1] = m33[0][1];
  m.m[0][2] = m33[0][2];
  m.m[1][0] = m33[1][0];
  m.m[1][1] = m33[1][1];
  m.m[1][2] = m33[1][2];
  m.m[2][0] = m33[2][0];
  m.m[2][1] = m33[2][1];
  m.m[2][2] = m33[2][2];

  return m;
}